

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dofhandler.cc
# Opt level: O3

span<const_long,_18446744073709551615UL> __thiscall
lf::assemble::DynamicFEDofHandler::InteriorGlobalDofIndices
          (DynamicFEDofHandler *this,Entity *entity)

{
  uint uVar1;
  element_type *peVar2;
  long lVar3;
  int iVar4;
  dim_t dVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  span<const_long,_18446744073709551615UL> sVar10;
  
  iVar4 = (*entity->_vptr_Entity[4])(entity);
  dVar5 = base::internal::DimensionImpl((RefElType)iVar4);
  uVar9 = (ulong)(2 - dVar5);
  peVar2 = (this->mesh_p_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  uVar6 = (*peVar2->_vptr_Mesh[5])(peVar2,entity);
  lVar3 = *(long *)(&((array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_3UL> *)
                     (&this->dofs_ + -1))->field_0x0 + uVar9 * 0x18);
  uVar1 = *(uint *)(lVar3 + (ulong)uVar6 * 4);
  uVar8 = *(int *)(lVar3 + (ulong)(uVar6 + 1) * 4) - uVar1;
  uVar7 = (ulong)(uVar8 - *(int *)(*(long *)(&(this->num_int_dofs_).field_0x0 + uVar9 * 0x18) +
                                  (ulong)uVar6 * 4));
  sVar10._M_extent._M_extent_value = uVar8 - uVar7;
  sVar10._M_ptr =
       (this->dofs_)._M_elems[uVar9].super__Vector_base<long,_std::allocator<long>_>._M_impl.
       super__Vector_impl_data._M_start + uVar1 + uVar7;
  return sVar10;
}

Assistant:

std::span<const gdof_idx_t> DynamicFEDofHandler::InteriorGlobalDofIndices(
    const lf::mesh::Entity &entity) const {
  // Topological type
  const lf::base::RefEl ref_el_type = entity.RefEl();
  // Co-dimension of entity in a 2D mesh
  const dim_t codim = 2 - ref_el_type.Dimension();
  // Index of current mesh entity
  const glb_idx_t entity_index = mesh_p_->Index(entity);
  // Offset of indices for current entity
  const size_type idx_offset = offsets_[codim][entity_index];
  // Number of shape functions covering current entity
  const size_type no_covered_dofs =
      offsets_[codim][entity_index + 1] - idx_offset;
  // Number of shape functions associated with the current entity
  const size_type no_loc_dofs = num_int_dofs_[codim][entity_index];
  // Pointers to range of dof indices
  const gdof_idx_t *begin = dofs_[codim].data() + idx_offset;
  const gdof_idx_t *end = begin + no_covered_dofs;
  // Move pointer to location of indices for interior dofs
  // This is the only difference to GlobalDofIndices()
  begin += (no_covered_dofs - no_loc_dofs);
  return {begin, end};
}